

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::UmulExtendedCase::compare
          (UmulExtendedCase *this,void **inputs,void **outputs)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ostringstream *this_00;
  ulong uVar8;
  Hex<8UL> local_38;
  
  iVar2 = glu::getDataTypeScalarSize
                    ((((this->super_IntegerFunctionCase).m_spec.inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  bVar4 = iVar2 < 1;
  if (0 < iVar2) {
    uVar7 = (ulong)*inputs[1] * (ulong)**inputs;
    uVar5 = uVar7 >> 0x20;
    uVar8 = 0;
    if (**outputs == (int)(uVar7 >> 0x20)) {
      uVar6 = 0;
      do {
        if (*(int *)((long)outputs[1] + uVar6 * 4) != (int)uVar7) {
          uVar8 = uVar6 & 0xffffffff;
          break;
        }
        bVar4 = iVar2 <= (int)uVar6 + 1;
        if (iVar2 + -1 == (int)uVar6) {
          return bVar4;
        }
        uVar7 = (ulong)*(uint *)((long)inputs[1] + (uVar6 + 1) * 4) *
                (ulong)*(uint *)((long)*inputs + (uVar6 + 1) * 4);
        uVar5 = uVar7 >> 0x20;
        uVar8 = uVar6 + 1;
        lVar1 = uVar6 + 1;
        uVar6 = uVar8;
      } while (*(int *)((long)*outputs + lVar1 * 4) == (int)(uVar7 >> 0x20));
    }
    this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>
              (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
    poVar3 = (ostream *)std::ostream::operator<<(this_00,(int)uVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] = ",4);
    local_38.value = uVar5;
    poVar3 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    local_38.value = uVar7 & 0xffffffff;
    tcu::Format::Hex<8UL>::toStream(&local_38,poVar3);
  }
  return bVar4;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	in0		= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	in1		= ((const deUint32*)inputs[1])[compNdx];
			const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	out1	= ((const deUint32*)outputs[1])[compNdx];
			const deUint64	mul64	= deUint64(in0)*deUint64(in1);
			const deUint32	ref0	= deUint32(mul64 >> 32);
			const deUint32	ref1	= deUint32(mul64 & 0xffffffffu);

			if (out0 != ref0 || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}